

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quath *q)

{
  long lVar1;
  double *pdVar2;
  matrix3d *pmVar3;
  byte bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double3x3 m33;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58 [9];
  
  bVar4 = 0;
  fVar5 = value::half_to_float((half)(q->imag)._M_elems[0].value);
  fVar6 = value::half_to_float((half)(q->imag)._M_elems[1].value);
  fVar7 = value::half_to_float((half)(q->imag)._M_elems[2].value);
  fVar8 = value::half_to_float((half)(q->real).value);
  local_78._8_4_ = SUB84((double)fVar6,0);
  local_78._0_8_ = (double)fVar5;
  local_78._12_4_ = (int)((ulong)(double)fVar6 >> 0x20);
  local_68 = (double)fVar7;
  dStack_60 = (double)fVar8;
  linalg::qmat<double>((vec<double,_4> *)local_78);
  pdVar2 = local_58;
  pmVar3 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pmVar3->m[0][0] = *pdVar2;
    pdVar2 = pdVar2 + (ulong)bVar4 * -2 + 1;
    pmVar3 = (matrix3d *)((long)pmVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quath &q) {
  double3x3 m33 = linalg::qmat<double>(
      {double(half_to_float(q.imag[0])), double(half_to_float(q.imag[1])),
       double(half_to_float(q.imag[2])), double(half_to_float(q.real))});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}